

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::RenderDeviceGLImpl::CreateShader
          (RenderDeviceGLImpl *this,ShaderCreateInfo *ShaderCreateInfo,IShader **ppShader,
          IDataBlob **ppCompilerOutput,bool bIsDeviceInternal)

{
  anon_class_40_5_9706b020 ConstructObject;
  CreateInfo GLShaderCI;
  undefined1 local_49;
  RenderDeviceGLImpl *local_48;
  ShaderCreateInfo *pSStack_40;
  RenderDeviceInfo **local_38;
  undefined1 *puStack_30;
  IShader ***local_28;
  IShader **local_20;
  RenderDeviceInfo *local_18;
  GraphicsAdapterInfo *local_10;
  IDataBlob **local_8;
  
  puStack_30 = &local_49;
  local_18 = &(this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo;
  local_38 = &local_18;
  local_10 = &(this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_AdapterInfo;
  local_28 = &local_20;
  ConstructObject.ShaderCI = ShaderCreateInfo;
  ConstructObject.this = &this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>;
  ConstructObject.ExtraArgs = (CreateInfo *)local_38;
  ConstructObject._24_8_ = puStack_30;
  ConstructObject.ppShader = local_28;
  local_49 = bIsDeviceInternal;
  local_48 = this;
  pSStack_40 = ShaderCreateInfo;
  local_20 = ppShader;
  local_8 = ppCompilerOutput;
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateDeviceObject<Diligent::IShader,Diligent::ShaderDesc,Diligent::RenderDeviceBase<Diligent::EngineGLImplTraits>::CreateShaderImpl<Diligent::ShaderGLImpl::CreateInfo,bool>(Diligent::IShader**,Diligent::ShaderCreateInfo_const&,Diligent::ShaderGLImpl::CreateInfo_const&,bool_const&)::_lambda()_1_>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,"Shader",
             &ShaderCreateInfo->Desc,ppShader,ConstructObject);
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateShader(const ShaderCreateInfo& ShaderCreateInfo,
                                      IShader**               ppShader,
                                      IDataBlob**             ppCompilerOutput,
                                      bool                    bIsDeviceInternal)
{
    const ShaderGLImpl::CreateInfo GLShaderCI{
        GetDeviceInfo(),
        GetAdapterInfo(),
        ppCompilerOutput,
    };
    CreateShaderImpl(ppShader, ShaderCreateInfo, GLShaderCI, bIsDeviceInternal);
}